

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorRasterizerTests.cpp
# Opt level: O0

void __thiscall
agge::tests::VectorRasterizerTests::InPixelRectsAreProperlyRasterizedToCells
          (VectorRasterizerTests *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  cells_container *pcVar5;
  allocator local_141;
  string local_140 [32];
  LocationInfo local_120;
  undefined1 local_f8 [8];
  cell reference2 [1];
  LocationInfo local_c8;
  undefined1 local_a0 [8];
  cell reference1 [1];
  undefined1 local_88 [8];
  vector_rasterizer vr;
  VectorRasterizerTests *this_local;
  
  vr._112_8_ = this;
  vector_rasterizer::vector_rasterizer((vector_rasterizer *)local_88);
  iVar1 = anon_unknown_5::fp(15.1);
  iVar2 = anon_unknown_5::fp(10.1);
  iVar3 = anon_unknown_5::fp(15.4);
  iVar4 = anon_unknown_5::fp(10.1);
  vector_rasterizer::line((vector_rasterizer *)local_88,iVar1,iVar2,iVar3,iVar4);
  iVar1 = anon_unknown_5::fp(15.4);
  iVar2 = anon_unknown_5::fp(10.1);
  iVar3 = anon_unknown_5::fp(15.4);
  iVar4 = anon_unknown_5::fp(10.7);
  vector_rasterizer::line((vector_rasterizer *)local_88,iVar1,iVar2,iVar3,iVar4);
  iVar1 = anon_unknown_5::fp(15.4);
  iVar2 = anon_unknown_5::fp(10.7);
  iVar3 = anon_unknown_5::fp(15.1);
  iVar4 = anon_unknown_5::fp(10.7);
  vector_rasterizer::line((vector_rasterizer *)local_88,iVar1,iVar2,iVar3,iVar4);
  iVar1 = anon_unknown_5::fp(15.1);
  iVar2 = anon_unknown_5::fp(10.7);
  iVar3 = anon_unknown_5::fp(15.1);
  iVar4 = anon_unknown_5::fp(10.1);
  vector_rasterizer::line((vector_rasterizer *)local_88,iVar1,iVar2,iVar3,iVar4);
  local_a0._0_2_ = 0xf;
  local_a0._2_2_ = 10;
  local_a0._4_4_ = 0x5ad8;
  reference1[0].x = 0;
  pcVar5 = vector_rasterizer::cells((vector_rasterizer *)local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&reference2[0].cover,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,(allocator *)((long)&reference2[0].area + 3));
  ut::LocationInfo::LocationInfo(&local_c8,(string *)&reference2[0].cover,0x208);
  ut::
  are_equal<agge::vector_rasterizer::cell_const,1ul,agge::pod_vector<agge::vector_rasterizer::cell>>
            ((cell (*) [1])local_a0,pcVar5,&local_c8);
  ut::LocationInfo::~LocationInfo(&local_c8);
  std::__cxx11::string::~string((string *)&reference2[0].cover);
  std::allocator<char>::~allocator((allocator<char> *)((long)&reference2[0].area + 3));
  vector_rasterizer::reset((vector_rasterizer *)local_88);
  iVar1 = anon_unknown_5::fp(17.15);
  iVar2 = anon_unknown_5::fp(101.1);
  iVar3 = anon_unknown_5::fp(17.15);
  iVar4 = anon_unknown_5::fp(101.6);
  vector_rasterizer::line((vector_rasterizer *)local_88,iVar1,iVar2,iVar3,iVar4);
  iVar1 = anon_unknown_5::fp(17.15);
  iVar2 = anon_unknown_5::fp(101.6);
  iVar3 = anon_unknown_5::fp(17.89);
  iVar4 = anon_unknown_5::fp(101.6);
  vector_rasterizer::line((vector_rasterizer *)local_88,iVar1,iVar2,iVar3,iVar4);
  iVar1 = anon_unknown_5::fp(17.89);
  iVar2 = anon_unknown_5::fp(101.6);
  iVar3 = anon_unknown_5::fp(17.89);
  iVar4 = anon_unknown_5::fp(101.1);
  vector_rasterizer::line((vector_rasterizer *)local_88,iVar1,iVar2,iVar3,iVar4);
  iVar1 = anon_unknown_5::fp(17.89);
  iVar2 = anon_unknown_5::fp(101.1);
  iVar3 = anon_unknown_5::fp(17.15);
  iVar4 = anon_unknown_5::fp(101.1);
  vector_rasterizer::line((vector_rasterizer *)local_88,iVar1,iVar2,iVar3,iVar4);
  local_f8._0_2_ = 0x11;
  local_f8._2_2_ = 0x65;
  local_f8._4_4_ = -0xbe00;
  reference2[0].x = 0;
  pcVar5 = vector_rasterizer::cells((vector_rasterizer *)local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_140,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,&local_141);
  ut::LocationInfo::LocationInfo(&local_120,(string *)local_140,0x218);
  ut::
  are_equal<agge::vector_rasterizer::cell_const,1ul,agge::pod_vector<agge::vector_rasterizer::cell>>
            ((cell (*) [1])local_f8,pcVar5,&local_120);
  ut::LocationInfo::~LocationInfo(&local_120);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  vector_rasterizer::~vector_rasterizer((vector_rasterizer *)local_88);
  return;
}

Assistant:

test( InPixelRectsAreProperlyRasterizedToCells )
			{
				// INIT
				vector_rasterizer vr;

				// ACT (76 x 153)
				vr.line(fp(15.1), fp(10.1), fp(15.4), fp(10.1));
				vr.line(fp(15.4), fp(10.1), fp(15.4), fp(10.7));
				vr.line(fp(15.4), fp(10.7), fp(15.1), fp(10.7));
				vr.line(fp(15.1), fp(10.7), fp(15.1), fp(10.1));

				// ASSERT
				const vector_rasterizer::cell reference1[] = {
					{ 15, 10, 2 * 11628, 0 },
				};

				assert_equal(reference1, vr.cells());

				// INIT
				vr.reset();

				// ACT (190 x 128)
				vr.line(fp(17.15), fp(101.1), fp(17.15), fp(101.6));
				vr.line(fp(17.15), fp(101.6), fp(17.89), fp(101.6));
				vr.line(fp(17.89), fp(101.6), fp(17.89), fp(101.1));
				vr.line(fp(17.89), fp(101.1), fp(17.15), fp(101.1));

				// ASSERT
				const vector_rasterizer::cell reference2[] = {
					{ 17, 101, -2 * 24320, 0 },
				};

				assert_equal(reference2, vr.cells());
			}